

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O1

QSize __thiscall
QPixmapStyle::lineEditSizeFromContents
          (QPixmapStyle *this,QStyleOption *option,QSize *contentsSize,QWidget *param_3)

{
  int iVar1;
  QPixmapStyleDescriptor *this_00;
  QStyle *pQVar2;
  QSize QVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  ControlDescriptor local_74;
  QPixmapStyleDescriptor local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_74 = LE_Enabled;
  this_00 = QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
                      (&local_70,
                       (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)
                       (*(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8 + 0xe8),
                       &local_74);
  pQVar2 = QStyle::proxy((QStyle *)this_00);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xe0))(pQVar2,5,option,0);
  iVar4 = (contentsSize->wd).m_i;
  iVar5 = (contentsSize->ht).m_i;
  if (&(local_70.fileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_70.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_70.fileName.d.d)->super_QArrayData,2,0x10);
    }
  }
  iVar5 = local_70.margins.m_top.m_i + local_70.margins.m_bottom.m_i + iVar5 + iVar1 * 2;
  if (local_70.size.ht.m_i <= iVar5) {
    local_70.size.ht.m_i = iVar5;
  }
  if (local_70.tileRules.vertical == RepeatTile) {
    local_70.size.ht.m_i = iVar5;
  }
  iVar4 = local_70.margins.m_left.m_i + local_70.margins.m_right.m_i + iVar4 + iVar1 * 2;
  if (local_70.size.wd.m_i <= iVar4) {
    local_70.size.wd.m_i = iVar4;
  }
  if (local_70.tileRules.horizontal == RepeatTile) {
    local_70.size.wd.m_i = iVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar3.ht.m_i = local_70.size.ht.m_i;
    QVar3.wd.m_i = local_70.size.wd.m_i;
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSize QPixmapStyle::lineEditSizeFromContents(const QStyleOption *option,
                                             const QSize &contentsSize, const QWidget *) const
{
    Q_D(const QPixmapStyle);

    const QPixmapStyleDescriptor &desc = d->descriptors.value(LE_Enabled);
    const int border = 2 * proxy()->pixelMetric(PM_DefaultFrameWidth, option);

    int w = contentsSize.width() + border + desc.margins.left() + desc.margins.right();
    int h = contentsSize.height() + border + desc.margins.top() + desc.margins.bottom();

    return d->computeSize(desc, w, h);
}